

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeAtomicRMW<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          AtomicRMWOp op,Type type,uint8_t bytes)

{
  __index_type *__return_storage_ptr___00;
  Ok *pOVar1;
  bool bVar2;
  Ok local_139;
  Err local_138;
  Err *local_118;
  Err *err_1;
  Result<wasm::WATParser::Ok> _val_1;
  Result<wasm::WATParser::Ok> arg;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  MaybeResult<wasm::WATParser::Ok> _val;
  MaybeResult<wasm::WATParser::Ok> mem;
  uint8_t bytes_local;
  AtomicRMWOp op_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  Type type_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x20);
  maybeMemidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
            ((MaybeResult<wasm::WATParser::Ok> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::WATParser::Ok>::MaybeResult
            ((MaybeResult<wasm::WATParser::Ok> *)local_80,
             (MaybeResult<wasm::WATParser::Ok> *)__return_storage_ptr___00);
  local_98 = MaybeResult<wasm::WATParser::Ok>::getErr((MaybeResult<wasm::WATParser::Ok> *)local_80);
  bVar2 = local_98 == (Err *)0x0;
  if (!bVar2) {
    WATParser::Err::Err(&local_b8,local_98);
    Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_b8);
    WATParser::Err::~Err(&local_b8);
  }
  MaybeResult<wasm::WATParser::Ok>::~MaybeResult((MaybeResult<wasm::WATParser::Ok> *)local_80);
  if (bVar2) {
    memarg<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
              ((Result<wasm::WATParser::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),ctx
               ,(uint)bytes);
    Result<wasm::WATParser::Ok>::Result
              ((Result<wasm::WATParser::Ok> *)&err_1,
               (Result<wasm::WATParser::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
    local_118 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)&err_1);
    bVar2 = local_118 == (Err *)0x0;
    if (!bVar2) {
      WATParser::Err::Err(&local_138,local_118);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_138);
      WATParser::Err::~Err(&local_138);
    }
    Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)&err_1);
    if (bVar2) {
      pOVar1 = MaybeResult<wasm::WATParser::Ok>::getPtr
                         ((MaybeResult<wasm::WATParser::Ok> *)
                          ((long)&_val.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          + 0x20));
      Result<wasm::WATParser::Ok>::operator*
                ((Result<wasm::WATParser::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      NullInstrParserCtx::makeAtomicRMW((NullInstrParserCtx *)ctx,pos,op,type.id,bytes,pOVar1);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_139);
    }
    Result<wasm::WATParser::Ok>::~Result
              ((Result<wasm::WATParser::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
  }
  MaybeResult<wasm::WATParser::Ok>::~MaybeResult
            ((MaybeResult<wasm::WATParser::Ok> *)
             ((long)&_val.val.
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT>
makeAtomicRMW(Ctx& ctx, Index pos, AtomicRMWOp op, Type type, uint8_t bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeAtomicRMW(pos, op, type, bytes, mem.getPtr(), *arg);
}